

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

MemOp tcg_canonicalize_memop(MemOp op,_Bool is64,_Bool st)

{
  MemOp MVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  switch(op & MO_64) {
  case MO_8:
    op = op & ~MO_BE;
    break;
  case MO_32:
    if (!is64) {
      op = op & ~MO_ASHIFT;
    }
    break;
  case MO_64:
    if (!is64) {
      fprintf(_stderr,"%s:%d: tcg fatal error\n",
              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op.c"
              ,0xaf5,in_R8,in_R9,
              (long)&switchD_00b2b7fe::switchdataD_00bd3d08 +
              (long)(int)(&switchD_00b2b7fe::switchdataD_00bd3d08)[op & MO_64]);
      abort();
    }
  }
  MVar1 = op & ~MO_ASHIFT;
  if (!st) {
    MVar1 = op;
  }
  return MVar1;
}

Assistant:

static inline MemOp tcg_canonicalize_memop(MemOp op, bool is64, bool st)
{
    /* Trigger the asserts within as early as possible.  */
    (void)get_alignment_bits(op);

    switch (op & MO_SIZE) {
    case MO_8:
        op &= ~MO_BSWAP;
        break;
    case MO_16:
        break;
    case MO_32:
        if (!is64) {
            op &= ~MO_SIGN;
        }
        break;
    case MO_64:
        if (!is64) {
            tcg_abort();
        }
        break;
    }
    if (st) {
        op &= ~MO_SIGN;
    }
    return op;
}